

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_joystick.cpp
# Opt level: O3

void __thiscall
SDLInputJoystickManager::GetDevices
          (SDLInputJoystickManager *this,TArray<IJoystickConfig_*,_IJoystickConfig_*> *sticks)

{
  uint uVar1;
  SDLInputJoystick *pSVar2;
  ulong uVar3;
  
  if ((this->Joysticks).Count != 0) {
    uVar3 = 0;
    do {
      M_LoadJoystickConfig(&(this->Joysticks).Array[uVar3]->super_IJoystickConfig);
      pSVar2 = (this->Joysticks).Array[uVar3];
      TArray<IJoystickConfig_*,_IJoystickConfig_*>::Grow(sticks,1);
      uVar1 = sticks->Count;
      sticks->Array[uVar1] = &pSVar2->super_IJoystickConfig;
      sticks->Count = uVar1 + 1;
      uVar3 = uVar3 + 1;
    } while (uVar3 < (this->Joysticks).Count);
  }
  return;
}

Assistant:

void GetDevices(TArray<IJoystickConfig *> &sticks)
	{
		for(unsigned int i = 0;i < Joysticks.Size();i++)
		{
			M_LoadJoystickConfig(Joysticks[i]);
			sticks.Push(Joysticks[i]);
		}
	}